

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralMeshDenoising.cpp
# Opt level: O2

void __thiscall BilateralMeshDenoising::initParameters(BilateralMeshDenoising *this)

{
  ParameterSet *this_00;
  string local_40;
  allocator local_19;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Iteration Num.",&local_19);
  ParameterSet::addParameter(this_00,&local_40,5);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void BilateralMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("Iteration Num."), 5);
}